

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall
QGraphicsPathItem::QGraphicsPathItem
          (QGraphicsPathItem *this,QPainterPath *path,QGraphicsItem *parent)

{
  ulong uVar1;
  QAbstractGraphicsShapeItemPrivate *in_RDX;
  QAbstractGraphicsShapeItem *in_RSI;
  QGraphicsPathItemPrivate *in_RDI;
  
  operator_new(0x1b0);
  QGraphicsPathItemPrivate::QGraphicsPathItemPrivate(in_RDI);
  QAbstractGraphicsShapeItem::QAbstractGraphicsShapeItem(in_RSI,in_RDX,(QGraphicsItem *)in_RDI);
  (in_RDI->super_QAbstractGraphicsShapeItemPrivate).super_QGraphicsItemPrivate.
  _vptr_QGraphicsItemPrivate = (_func_int **)&PTR__QGraphicsPathItem_00d32768;
  uVar1 = QPainterPath::isEmpty();
  if ((uVar1 & 1) == 0) {
    setPath((QGraphicsPathItem *)in_RDX,(QPainterPath *)in_RDI);
  }
  return;
}

Assistant:

QGraphicsPathItem::QGraphicsPathItem(const QPainterPath &path,
                                     QGraphicsItem *parent)
    : QAbstractGraphicsShapeItem(*new QGraphicsPathItemPrivate, parent)
{
    if (!path.isEmpty())
        setPath(path);
}